

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::CastExpression::Deserialize(CastExpression *this,Deserializer *deserializer)

{
  CastExpression *this_00;
  pointer pCVar1;
  _Head_base<0UL,_duckdb::CastExpression_*,_false> local_20;
  
  this_00 = (CastExpression *)operator_new(0x60);
  CastExpression(this_00);
  local_20._M_head_impl = this_00;
  pCVar1 = unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>::
           operator->((unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>
                       *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (deserializer,200,"child",&pCVar1->child);
  pCVar1 = unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>::
           operator->((unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>
                       *)&local_20);
  Deserializer::ReadProperty<duckdb::LogicalType>(deserializer,0xc9,"cast_type",&pCVar1->cast_type);
  pCVar1 = unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>::
           operator->((unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>
                       *)&local_20);
  Deserializer::ReadPropertyWithDefault<bool>(deserializer,0xca,"try_cast",&pCVar1->try_cast);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> CastExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<CastExpression>(new CastExpression());
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(200, "child", result->child);
	deserializer.ReadProperty<LogicalType>(201, "cast_type", result->cast_type);
	deserializer.ReadPropertyWithDefault<bool>(202, "try_cast", result->try_cast);
	return std::move(result);
}